

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall
kj::HttpService::Response::sendError
          (Response *this,uint statusCode,StringPtr statusText,HttpHeaders *headers)

{
  undefined1 *puVar1;
  Disposer *node;
  long *plVar2;
  undefined4 in_register_00000034;
  Promise<void> promise;
  Own<kj::AsyncOutputStream,_std::nullptr_t> stream;
  Own<kj::AsyncOutputStream,_std::nullptr_t> local_48;
  long *local_38;
  undefined1 local_30;
  undefined1 *local_28;
  
  puVar1 = (undefined1 *)((long)&headers[-1].ownedStrings.builder.disposer + 7);
  local_30 = 1;
  local_28 = puVar1;
  (*(code *)**(undefined8 **)CONCAT44(in_register_00000034,statusCode))
            (&local_48.ptr,(undefined8 *)CONCAT44(in_register_00000034,statusCode),
             statusText.content.ptr);
  (**(code **)*local_38)(&local_48,local_38,statusText.content.size_,puVar1);
  Promise<void>::attach<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
            ((Promise<void> *)this,&local_48);
  node = local_48.disposer;
  if ((PromiseArenaMember *)local_48.disposer != (PromiseArenaMember *)0x0) {
    local_48.disposer = (Disposer *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  plVar2 = local_38;
  if (local_38 != (long *)0x0) {
    local_38 = (long *)0x0;
    (**(local_48.ptr)->_vptr_AsyncOutputStream)
              (local_48.ptr,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpService::Response::sendError(
    uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers) {
  auto stream = send(statusCode, statusText, headers, statusText.size());
  auto promise = stream->write(statusText.asBytes());
  return promise.attach(kj::mv(stream));
}